

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O0

string * re2::FlattenedProgToString_abi_cxx11_(Prog *prog,int start)

{
  uint uVar1;
  int iVar2;
  undefined8 uVar3;
  uint in_EDX;
  Prog *in_RSI;
  string *in_RDI;
  Inst *ip;
  int id;
  string *s;
  uint in_stack_ffffffffffffff1c;
  uint in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  string local_b8 [16];
  Inst *in_stack_ffffffffffffff58;
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  Inst *local_38;
  uint local_1c;
  undefined1 local_15;
  uint local_14;
  Prog *local_10;
  
  local_15 = 0;
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::__cxx11::string::string((string *)in_RDI);
  for (local_1c = local_14; uVar1 = local_1c, iVar2 = Prog::size(local_10), (int)uVar1 < iVar2;
      local_1c = local_1c + 1) {
    local_38 = Prog::inst((Prog *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                          in_stack_ffffffffffffff1c);
    in_stack_ffffffffffffff24 = Prog::Inst::last(local_38);
    if (in_stack_ffffffffffffff24 == 0) {
      in_stack_ffffffffffffff1c = local_1c;
      Prog::Inst::Dump_abi_cxx11_(in_stack_ffffffffffffff58);
      uVar3 = std::__cxx11::string::c_str();
      StringPrintf_abi_cxx11_((char *)local_98,"%d+ %s\n",(ulong)in_stack_ffffffffffffff1c,uVar3);
      std::__cxx11::string::operator+=((string *)in_RDI,local_98);
      std::__cxx11::string::~string(local_98);
      std::__cxx11::string::~string(local_b8);
    }
    else {
      in_stack_ffffffffffffff20 = local_1c;
      Prog::Inst::Dump_abi_cxx11_(in_stack_ffffffffffffff58);
      uVar3 = std::__cxx11::string::c_str();
      StringPrintf_abi_cxx11_((char *)local_58,"%d. %s\n",(ulong)in_stack_ffffffffffffff20,uVar3);
      std::__cxx11::string::operator+=((string *)in_RDI,local_58);
      std::__cxx11::string::~string(local_58);
      std::__cxx11::string::~string(local_78);
    }
  }
  return in_RDI;
}

Assistant:

static std::string FlattenedProgToString(Prog* prog, int start) {
  std::string s;
  for (int id = start; id < prog->size(); id++) {
    Prog::Inst* ip = prog->inst(id);
    if (ip->last())
      s += StringPrintf("%d. %s\n", id, ip->Dump().c_str());
    else
      s += StringPrintf("%d+ %s\n", id, ip->Dump().c_str());
  }
  return s;
}